

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O1

C_Node * equality(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  bool bVar1;
  C_Token *tok_00;
  _Bool _Var2;
  C_Node *pCVar3;
  C_Node *pCVar4;
  C_Node *pCVar5;
  C_Node *local_48;
  C_Token *local_38;
  
  local_38 = tok;
  pCVar3 = relational(parser,&local_38,tok);
  do {
    tok_00 = local_38;
    _Var2 = C_equal(local_38,"==");
    if (_Var2) {
      pCVar4 = relational(parser,&local_38,tok_00->next);
      pCVar5 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar5->kind = ND_EQ;
LAB_00127156:
      pCVar5->tok = tok_00;
      pCVar5->lhs = pCVar3;
      pCVar5->rhs = pCVar4;
      bVar1 = true;
      pCVar3 = pCVar5;
    }
    else {
      _Var2 = C_equal(tok_00,"!=");
      if (_Var2) {
        pCVar4 = relational(parser,&local_38,tok_00->next);
        pCVar5 = (C_Node *)
                 (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
        pCVar5->kind = ND_NE;
        goto LAB_00127156;
      }
      *rest = tok_00;
      bVar1 = false;
      local_48 = pCVar3;
    }
    if (!bVar1) {
      return local_48;
    }
  } while( true );
}

Assistant:

static C_Node *equality(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Node *node = relational(parser, &tok, tok);

  for (;;) {
    C_Token *start = tok;

    if (C_equal(tok, "==")) {
      node = new_binary(parser, ND_EQ, node, relational(parser, &tok, tok->next), start);
      continue;
    }

    if (C_equal(tok, "!=")) {
      node = new_binary(parser, ND_NE, node, relational(parser, &tok, tok->next), start);
      continue;
    }

    *rest = tok;
    return node;
  }
}